

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::shader_image_atomic
               (NegativeTestContext *ctx)

{
  char *__s;
  string shaderSource;
  size_t sVar1;
  long lVar2;
  ostringstream source;
  undefined1 *in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  long in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,
             "GL_OES_shader_image_atomic features require enabling the extension in 310 es shaders."
             ,"");
  NegativeTestContext::beginSection(ctx,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  lVar2 = 0;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "#version 310 es\nlayout(binding=0, r32ui) coherent uniform highp uimage2D u_image;\nprecision mediump float;\nvoid main()\n{\n\t"
               ,0x7a);
    __s = *(char **)((long)shader_image_atomic::s_tests + lVar2);
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n}\n",3);
    std::__cxx11::stringbuf::str();
    shaderSource._M_string_length = in_stack_fffffffffffffe40;
    shaderSource._M_dataplus._M_p = in_stack_fffffffffffffe38;
    shaderSource.field_2._M_allocated_capacity = in_stack_fffffffffffffe48;
    shaderSource.field_2._8_8_ = in_stack_fffffffffffffe50;
    verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)&DAT_00000001,
                 (ShaderType)in_stack_fffffffffffffe38,shaderSource,
                 (ExpectResult)in_stack_fffffffffffffe40);
    if (in_stack_fffffffffffffe38 != &stack0xfffffffffffffe48) {
      operator_delete(in_stack_fffffffffffffe38,in_stack_fffffffffffffe48 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x40);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void shader_image_atomic (NegativeTestContext& ctx)
{
	static const char* const s_tests[] =
	{
		"imageAtomicAdd(u_image, ivec2(1, 1), 1u);",
		"imageAtomicMin(u_image, ivec2(1, 1), 1u);",
		"imageAtomicMax(u_image, ivec2(1, 1), 1u);",
		"imageAtomicAnd(u_image, ivec2(1, 1), 1u);",
		"imageAtomicOr(u_image, ivec2(1, 1), 1u);",
		"imageAtomicXor(u_image, ivec2(1, 1), 1u);",
		"imageAtomicExchange(u_image, ivec2(1, 1), 1u);",
		"imageAtomicCompSwap(u_image, ivec2(1, 1), 1u, 1u);",
	};

	ctx.beginSection("GL_OES_shader_image_atomic features require enabling the extension in 310 es shaders.");
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_tests); ++ndx)
	{
		std::ostringstream source;
		source <<	"#version 310 es\n"
					"layout(binding=0, r32ui) coherent uniform highp uimage2D u_image;\n"
					"precision mediump float;\n"
					"void main()\n"
					"{\n"
					"	" << s_tests[ndx] << "\n"
					"}\n";
		verifyShader(ctx, glu::SHADERTYPE_FRAGMENT, source.str(), EXPECT_RESULT_FAIL);
	}
	ctx.endSection();
}